

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O0

string * __thiscall Dependency::getInstallPath_abi_cxx11_(Dependency *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_30 [48];
  
  Settings::destFolder_abi_cxx11_();
  std::operator+(in_RSI,in_RDI);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string Dependency::getInstallPath()
{
    return Settings::destFolder() + new_name;
}